

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::polygon_layer_to_gds(three_dim_model *this,int *layer_number)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  pointer corX;
  void *__buf;
  gdsSTR main;
  gdscpp my_polygons;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  gdsBOUNDARY local_340;
  gdsSTR local_2d8;
  gdscpp local_1e0;
  gdsSTR local_120;
  
  gdscpp::gdscpp(&local_1e0);
  gdsSTR::gdsSTR(&local_2d8);
  std::__cxx11::to_string((string *)&local_340,*layer_number);
  std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  local_340.plex = *layer_number;
  pmVar2 = std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::operator[](&this->polygons_map,(key_type_conflict *)&local_340);
  pcVar1 = (pmVar2->super__Vector_base<co_ord,_std::allocator<co_ord>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_340.plex = *layer_number;
  pmVar2 = std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::operator[](&this->polygons_map,(key_type_conflict *)&local_340);
  for (corX = (pmVar2->super__Vector_base<co_ord,_std::allocator<co_ord>_>)._M_impl.
              super__Vector_impl_data._M_start; corX != pcVar1; corX = corX + 1) {
    in_RCX = &corX->y;
    drawBoundary(&local_340,*layer_number,&corX->x,in_RCX);
    std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
              (&local_2d8.BOUNDARY,&local_340);
    gdsBOUNDARY::~gdsBOUNDARY(&local_340);
  }
  gdsSTR::gdsSTR(&local_120,&local_2d8);
  gdscpp::setSTR(&local_1e0,&local_120);
  gdsSTR::~gdsSTR(&local_120);
  std::operator+(&local_360,"data/",&local_2d8.name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_340,
                 &local_360,".gds");
  gdscpp::write(&local_1e0,(int)&local_340,__buf,(size_t)in_RCX);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  gdsSTR::~gdsSTR(&local_2d8);
  gdscpp::~gdscpp(&local_1e0);
  return;
}

Assistant:

void MODEL3D::three_dim_model::polygon_layer_to_gds(const int &layer_number)
{
    gdscpp my_polygons;
    gdsSTR main;
    main.name = std::to_string(layer_number);
    auto poly_end = polygons_map[layer_number].end();
    for (auto poly_it = polygons_map[layer_number].begin(); poly_it != poly_end; poly_it++)
    {
        main.BOUNDARY.push_back(drawBoundary( layer_number , poly_it->x, poly_it->y));
    }
    my_polygons.setSTR(main);
    my_polygons.write("data/"+main.name+".gds");
}